

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NewtFile.c
# Opt level: O2

newtRef NsLoad(newtRefArg rcvr,newtRefArg r)

{
  _Bool _Var1;
  newtRef nVar2;
  
  nVar2 = NsCompileFile(rcvr,r);
  _Var1 = NewtRefIsNIL(nVar2);
  if (_Var1) {
    return 0xfff2;
  }
  nVar2 = NVMCall(nVar2,0,(newtErr *)0x0);
  return nVar2;
}

Assistant:

newtRef NsLoad(newtRefArg rcvr, newtRefArg r)
{
    newtRefVar  result = kNewtRefUnbind;
    newtRefVar	fn;
    
    fn = NsCompileFile(rcvr, r);
    
    if (NewtRefIsNotNIL(fn))
        result = NVMCall(fn, 0, NULL);
    
    return result;
}